

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O0

void __thiscall pg::SSPMSolver::SSPMSolver(SSPMSolver *this,Oink *oink,Game *game)

{
  Game *game_local;
  Oink *oink_local;
  SSPMSolver *this_local;
  
  Solver::Solver(&this->super_Solver,oink,game);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__SSPMSolver_0029ca00;
  bitset::bitset(&this->pm_b);
  bitset::bitset(&this->tmp_b);
  bitset::bitset(&this->best_b);
  bitset::bitset(&this->test_b);
  uintqueue::uintqueue(&this->Q);
  bitset::bitset(&this->dirty);
  bitset::bitset(&this->unstable);
  this->bounded = false;
  this->lift_count = 0;
  this->lift_attempt = 0;
  return;
}

Assistant:

SSPMSolver::SSPMSolver(Oink& oink, Game& game) : Solver(oink, game)
{
}